

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator::
findNextLeaf(FastInstancesIterator *this)

{
  InstMatcher *this_00;
  int *piVar1;
  uint **ppuVar2;
  void ***pppvVar3;
  void **ppvVar4;
  void **ppvVar5;
  bool bVar6;
  bool separate;
  int iVar7;
  uint *puVar8;
  Node *pNVar9;
  Node *pNVar10;
  void **ppvVar11;
  NodeAlgorithm *pNVar12;
  uint specVar;
  TermList queryTerm;
  long *plVar13;
  Node *curr;
  Node *local_40;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*> local_38;
  
  if (this->_inLeaf == true) {
    if ((this->_alternatives)._cursor != (this->_alternatives)._stack) {
      SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                (&this->_subst);
      this->_inLeaf = false;
      local_40 = (Node *)0x0;
      separate = false;
LAB_003366e2:
      this_00 = &this->_subst;
LAB_003366f7:
      do {
        if (local_40 == (Node *)0x0) {
          pNVar9 = (Node *)0x0;
          do {
            ppvVar4 = (this->_alternatives)._stack;
            ppvVar5 = (this->_alternatives)._cursor;
            if (ppvVar5 == ppvVar4) {
              specVar = 0;
LAB_00336824:
              if (pNVar9 == (Node *)0x0) {
                return false;
              }
              goto LAB_00336830;
            }
            ppvVar11 = ppvVar5 + -1;
            (this->_alternatives)._cursor = ppvVar11;
            plVar13 = (long *)ppvVar5[-1];
            pNVar12 = (this->_nodeTypes)._cursor + -1;
            if (plVar13 != (long *)0x0) {
              if (*pNVar12 == UNSORTED_LIST) {
                pNVar9 = (Node *)*plVar13;
                if (plVar13[1] == 0) {
LAB_00336806:
                  (this->_nodeTypes)._cursor = pNVar12;
                  puVar8 = (this->_specVarNumbers)._cursor;
                  (this->_specVarNumbers)._cursor = puVar8 + -1;
                  specVar = puVar8[-1];
                  separate = false;
                  local_40 = pNVar9;
                  goto LAB_00336824;
                }
                local_40 = pNVar9;
                if (ppvVar11 == (this->_alternatives)._end) {
                  Lib::Stack<void_*>::expand(&this->_alternatives);
                  ppvVar11 = (this->_alternatives)._cursor;
                }
                plVar13 = plVar13 + 1;
              }
              else {
                pNVar9 = (Node *)*plVar13;
                plVar13 = (long *)plVar13[1];
                if (plVar13 == (long *)0x0) goto LAB_00336806;
                local_40 = pNVar9;
                if (ppvVar11 == (this->_alternatives)._end) {
                  Lib::Stack<void_*>::expand(&this->_alternatives);
                  ppvVar11 = (this->_alternatives)._cursor;
                }
              }
              *ppvVar11 = plVar13;
              pppvVar3 = &(this->_alternatives)._cursor;
              *pppvVar3 = *pppvVar3 + 1;
              specVar = (this->_specVarNumbers)._cursor[-1];
              separate = true;
              pNVar9 = local_40;
              goto LAB_00336824;
            }
            (this->_nodeTypes)._cursor = pNVar12;
            ppuVar2 = &(this->_specVarNumbers)._cursor;
            *ppuVar2 = *ppuVar2 + -1;
            if (ppvVar11 == ppvVar4) {
              pNVar10 = (Node *)0x0;
            }
            else {
              SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                        (this_00);
              pNVar9 = local_40;
              pNVar10 = local_40;
            }
          } while (pNVar10 == (Node *)0x0);
          specVar = 0;
          pNVar9 = pNVar10;
        }
        else {
          puVar8 = (this->_specVarNumbers)._cursor + -1;
          if (separate == false) {
            (this->_specVarNumbers)._cursor = puVar8;
          }
          specVar = *puVar8;
          pNVar9 = local_40;
        }
LAB_00336830:
        bVar6 = SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::
                matchNext(this_00,specVar,(TermList)(pNVar9->_term)._content,separate);
        if (bVar6) {
          do {
            iVar7 = (*local_40->_vptr_Node[2])();
            if ((((char)iVar7 != '\0') || (iVar7 = (*local_40->_vptr_Node[5])(), iVar7 != 1)) ||
               (*(int *)((long)&local_40[1]._vptr_Node + 4) != 1)) {
              iVar7 = (*local_40->_vptr_Node[2])();
              if ((char)iVar7 != '\0') {
                (*local_40->_vptr_Node[8])(&local_38);
                Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>::operator=
                          (&this->_ldIterator,&local_38);
                if (local_38._core !=
                    (IteratorCore<Inferences::ALASCA::FourierMotzkinConf::Rhs_*> *)0x0) {
                  piVar1 = &(local_38._core)->_refCnt;
                  *piVar1 = *piVar1 + -1;
                  if (*piVar1 == 0) {
                    (*(local_38._core)->_vptr_IteratorCore[1])();
                  }
                }
                this->_inLeaf = true;
                Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::reset(&(this->_subst)._derefBindings);
                return true;
              }
              separate = enterNode(this,&local_40);
              if (local_40 != (Node *)0x0) goto LAB_003366f7;
              goto LAB_003368eb;
            }
            pNVar9 = local_40 + 1;
            local_40 = (Node *)local_40[1]._term._content;
            queryTerm._content._4_4_ = 0;
            queryTerm._content._0_4_ = *(int *)&pNVar9->_vptr_Node * 4 + 3;
            bVar6 = SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::
                    matchNextAux(this_00,queryTerm,(TermList)(local_40->_term)._content,false);
          } while (bVar6);
          if ((separate != false) || ((this->_alternatives)._cursor != (this->_alternatives)._stack)
             ) {
            SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                      (this_00);
          }
          local_40 = (Node *)0x0;
          goto LAB_003366f7;
        }
        local_40 = (Node *)0x0;
        if (separate == false) {
LAB_003368eb:
          if ((this->_alternatives)._cursor != (this->_alternatives)._stack) {
            SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                      (this_00);
          }
        }
      } while( true );
    }
  }
  else {
    local_40 = this->_root;
    if (local_40 != (Node *)0x0) {
      this->_root = (Node *)0x0;
      separate = enterNode(this,&local_40);
      goto LAB_003366e2;
    }
  }
  return false;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastInstancesIterator::findNextLeaf()
{
  Node* curr;
  bool sibilingsRemain = false;
  if(_inLeaf) {
    if(_alternatives.isEmpty()) {
      return false;
    }
    _subst.backtrack();
    _inLeaf=false;
    curr=0;
  } else {
    if(!_root) {
      //If we aren't in a leaf and the findNextLeaf method has already been called,
      //it means that we're out of leafs.
      return false;
    }
    curr=_root;
    _root=0;
    sibilingsRemain=enterNode(curr);
  }
  for(;;) {
main_loop_start:
    unsigned currSpecVar = 0;

    if(curr) {
      if(sibilingsRemain) {
        ASS(_nodeTypes.top()!=UNSORTED_LIST || *static_cast<Node**>(_alternatives.top()));
        currSpecVar = _specVarNumbers.top();
      } else {
	      currSpecVar = _specVarNumbers.pop();
      }
    }
    //let's find a node we haven't been to...
    while(curr==0 && _alternatives.isNonEmpty()) {
      void* currAlt=_alternatives.pop();
      if(!currAlt) {
        //there's no alternative at this level, we have to backtrack
        _nodeTypes.pop();
        _specVarNumbers.pop();
        if(_alternatives.isNonEmpty()) {
	  _subst.backtrack();
	}
	continue;
      }

      NodeAlgorithm parentType = _nodeTypes.top();

      //the fact that we have alternatives means that here we are
      //matching by a variable (as there is always at most one child
      //for matching by term)
      if(parentType==UNSORTED_LIST) {
	Node** alts=static_cast<Node**>(currAlt);
	curr=*(alts++);
	if(*alts) {
	  _alternatives.push(alts);
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      } else {
	ASS_EQ(parentType,SKIP_LIST)
	auto alts = static_cast<typename SListIntermediateNode::NodeSkipList::Node *>(currAlt);
	ASS(alts);

	curr=alts->head();
	if(alts->tail()) {
	  _alternatives.push(alts->tail());
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      }

      if(sibilingsRemain) {
        currSpecVar = _specVarNumbers.top();
      } else {
        _nodeTypes.pop();
        currSpecVar = _specVarNumbers.pop();
      }
      ASS(curr);
      break;
    }
    if(!curr) {
      //there are no other alternatives
      return false;
    }
    if(!_subst.matchNext(currSpecVar, curr->term(), sibilingsRemain)) {	//[1]
      //match unsuccessful, try next alternative
      curr=0;
      if(!sibilingsRemain && _alternatives.isNonEmpty()) {
	_subst.backtrack();
      }
      continue;
    }
    while(!curr->isLeaf() && curr->algorithm()==UNSORTED_LIST && static_cast<UArrIntermediateNode*>(curr)->_size==1) {
      //a node with only one child, we don't need to bother with backtracking here.
      unsigned specVar=static_cast<UArrIntermediateNode*>(curr)->childVar;
      curr=static_cast<UArrIntermediateNode*>(curr)->_nodes[0];
      ASS(curr);
      if(!_subst.matchNext(specVar, curr->term(), false)) {
	//matching failed, let's go back to the node, that had multiple children
	//_subst.backtrack();
	if(sibilingsRemain || _alternatives.isNonEmpty()) {
	  //this backtrack can happen for two different reasons and have two different meanings:
	  //either matching at [1] was separated from the previous one and we're backtracking it,
	  //or it was not, which means it had no sibilings and we're backtracking from its parent.
	  _subst.backtrack();
	}
        curr=0;
        goto main_loop_start;
      }
    }
    if(curr->isLeaf()) {
      //we've found a leaf
      _ldIterator=static_cast<Leaf*>(curr)->allChildren();
      _inLeaf=true;
      _subst.onLeafEntered(); //we reset the bindings cache
      return true;
    }

    //let's go to the first child
    sibilingsRemain=enterNode(curr);
    if(curr==0 && _alternatives.isNonEmpty()) {
      _subst.backtrack();
    }
  }
}